

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_test.cc
# Opt level: O0

void __thiscall DHTest_InvalidParameters_Test::TestBody(DHTest_InvalidParameters_Test *this)

{
  bool bVar1;
  int iVar2;
  BIGNUM *__p;
  char *pcVar3;
  BIGNUM *pBVar4;
  pointer pbVar5;
  pointer pdVar6;
  pointer g_00;
  DH *dh_00;
  char *in_R9;
  string local_350;
  AssertHelper local_330;
  Message local_328;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__9;
  string local_2c0;
  AssertHelper local_2a0;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__8;
  string local_278;
  AssertHelper local_258;
  Message local_250;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<BIGNUM> large;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__5;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__4;
  string local_150;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<DH> dh;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIGNUM> g;
  string local_70;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> p;
  anon_class_1_0_00000001 check_invalid_group;
  DHTest_InvalidParameters_Test *this_local;
  
  __p = BN_get_rfc3526_prime_2048((BIGNUM *)0x0);
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_30,
             (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_30,(AssertionResult *)0x857c63,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
               ,0x1b8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar1) {
    pBVar4 = BN_new();
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (pointer)pBVar4);
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_90,
               (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,(AssertionResult *)0x855655,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x1ba,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (bVar1) {
      pBVar4 = (BIGNUM *)
               std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      local_d4 = BN_set_word(pBVar4,2);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_d0,&local_d4,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&dh,(internal *)local_d0,(AssertionResult *)"BN_set_word(g.get(), 2)",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x1bb,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)&dh);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        pBVar4 = (BIGNUM *)
                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        BN_set_negative(pBVar4,1);
        pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
        NewDHGroup((BIGNUM *)&gtest_ar__3.message_,pbVar5,(BIGNUM *)0x0);
        testing::AssertionResult::AssertionResult<std::unique_ptr<dh_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_120,
                   (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_150,(internal *)local_120,(AssertionResult *)0x83e994,"false","true",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x1c0,pcVar3);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          testing::Message::~Message(&local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
        if (bVar1) {
          pBVar4 = (BIGNUM *)
                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
          ;
          BN_set_negative(pBVar4,0);
          pdVar6 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
          TestBody::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     ((long)&p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7),pdVar6);
          pBVar4 = (BIGNUM *)
                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          BN_set_negative(pBVar4,1);
          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
          ;
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
          NewDHGroup((BIGNUM *)&gtest_ar__4.message_,pbVar5,(BIGNUM *)0x0);
          std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator=
                    ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                     (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          testing::AssertionResult::AssertionResult<std::unique_ptr<dh_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_168,
                     (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,(type *)0x0
                    );
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
          if (!bVar1) {
            testing::Message::Message(&local_170);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_198,(internal *)local_168,(AssertionResult *)0x83e994,"false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                       ,0x1c7,pcVar3);
            testing::internal::AssertHelper::operator=(&local_178,&local_170);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            std::__cxx11::string::~string((string *)&local_198);
            testing::Message::~Message(&local_170);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
          if (bVar1) {
            pBVar4 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            BN_set_negative(pBVar4,0);
            pdVar6 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
            ;
            TestBody::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       ((long)&p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7),pdVar6);
            pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
            NewDHGroup((BIGNUM *)&gtest_ar__5.message_,pbVar5,(BIGNUM *)0x0);
            std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator=
                      ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                       (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
            std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<dh_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1b0,
                       (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&large,(internal *)local_1b0,(AssertionResult *)0x83e994,"false",
                         "true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                         ,0x1cd,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string((string *)&large);
              testing::Message::~Message(&local_1b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
            if (bVar1) {
              pBVar4 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              BN_set_negative(pBVar4,0);
              pdVar6 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              TestBody::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         ((long)&p._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7),pdVar6)
              ;
              pBVar4 = BN_new();
              std::unique_ptr<bignum_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         (pointer)pBVar4);
              pBVar4 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__6.message_);
              local_1fc = BN_set_bit(pBVar4,0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1f8,&local_1fc,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
              if (!bVar1) {
                testing::Message::Message(&local_208);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1f8,
                           (AssertionResult *)"BN_set_bit(large.get(), 0)","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_210,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                           ,0x1d3,pcVar3);
                testing::internal::AssertHelper::operator=(&local_210,&local_208);
                testing::internal::AssertHelper::~AssertHelper(&local_210);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_208);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
              if (bVar1) {
                pBVar4 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__6.message_);
                local_244 = BN_set_bit(pBVar4,10000000);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_240,&local_244,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_240);
                if (!bVar1) {
                  testing::Message::Message(&local_250);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_278,(internal *)local_240,
                             (AssertionResult *)"BN_set_bit(large.get(), 10000000)","false","true",
                             in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_258,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                             ,0x1d4,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_258,&local_250);
                  testing::internal::AssertHelper::~AssertHelper(&local_258);
                  std::__cxx11::string::~string((string *)&local_278);
                  testing::Message::~Message(&local_250);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
                if (bVar1) {
                  pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__6.message_);
                  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                            );
                  NewDHGroup((BIGNUM *)&gtest_ar__8.message_,pbVar5,(BIGNUM *)0x0);
                  std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator=
                            ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                             (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_);
                  std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<dh_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_290,
                             (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                             (type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_290);
                  if (!bVar1) {
                    testing::Message::Message(&local_298);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_2c0,(internal *)local_290,(AssertionResult *)0x83e994,"false",
                               "true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                               ,0x1d6,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
                    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
                    std::__cxx11::string::~string((string *)&local_2c0);
                    testing::Message::~Message(&local_298);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
                  if (bVar1) {
                    pdVar6 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__3.message_);
                    TestBody::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)
                               ((long)&p._M_t.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7),
                               pdVar6);
                    pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    g_00 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__6.message_);
                    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                               &gtest_ar__1.message_);
                    NewDHGroup((BIGNUM *)&gtest_ar__9.message_,pbVar5,g_00);
                    std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator=
                              ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                               (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__9.message_);
                    std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__9.message_);
                    testing::AssertionResult::
                    AssertionResult<std::unique_ptr<dh_st,bssl::internal::Deleter>>
                              ((AssertionResult *)local_2d8,
                               (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                               (type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2d8);
                    if (!bVar1) {
                      testing::Message::Message(&local_2e0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_2d8,
                                 (AssertionResult *)0x83e994,"false","true",in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2e8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                                 ,0x1db,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
                      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_2e0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
                    if (bVar1) {
                      pdVar6 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      TestBody::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 ((long)&p._M_t.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7
                                 ),pdVar6);
                      dh_00 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                              ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__3.message_);
                      iVar2 = DH_generate_parameters_ex(dh_00,20000,5,(BN_GENCB *)0x0);
                      local_319 = iVar2 == 0;
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_318,&local_319,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_318);
                      if (!bVar1) {
                        testing::Message::Message(&local_328);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_350,(internal *)local_318,
                                   (AssertionResult *)
                                   "DH_generate_parameters_ex(dh.get(), 20000, 5, nullptr)","true",
                                   "false",in_R9);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_330,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                                   ,0x1e0,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_330,&local_328);
                        testing::internal::AssertHelper::~AssertHelper(&local_330);
                        std::__cxx11::string::~string((string *)&local_350);
                        testing::Message::~Message(&local_328);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                    }
                  }
                }
              }
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
            }
          }
        }
        std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(DHTest, InvalidParameters) {
  auto check_invalid_group = [](DH *dh) {
    // All operations on egregiously invalid groups should fail.
    EXPECT_FALSE(DH_generate_key(dh));
    int check_result;
    EXPECT_FALSE(DH_check(dh, &check_result));
    bssl::UniquePtr<BIGNUM> pub_key(BN_new());
    ASSERT_TRUE(pub_key);
    ASSERT_TRUE(BN_set_u64(pub_key.get(), 42));
    EXPECT_FALSE(DH_check_pub_key(dh, pub_key.get(), &check_result));
    uint8_t buf[1024];
    EXPECT_EQ(DH_compute_key(buf, pub_key.get(), dh), -1);
    EXPECT_EQ(DH_compute_key_padded(buf, pub_key.get(), dh), -1);
  };

  bssl::UniquePtr<BIGNUM> p(BN_get_rfc3526_prime_2048(nullptr));
  ASSERT_TRUE(p);
  bssl::UniquePtr<BIGNUM> g(BN_new());
  ASSERT_TRUE(g);
  ASSERT_TRUE(BN_set_word(g.get(), 2));

  // p is negative.
  BN_set_negative(p.get(), 1);
  bssl::UniquePtr<DH> dh = NewDHGroup(p.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  BN_set_negative(p.get(), 0);
  check_invalid_group(dh.get());

  // g is negative.
  BN_set_negative(g.get(), 1);
  dh = NewDHGroup(p.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  BN_set_negative(g.get(), 0);
  check_invalid_group(dh.get());

  // g is not reduced mod p.
  dh = NewDHGroup(p.get(), /*q=*/nullptr, p.get());
  ASSERT_TRUE(dh);
  BN_set_negative(g.get(), 0);
  check_invalid_group(dh.get());

  // p is too large.
  bssl::UniquePtr<BIGNUM> large(BN_new());
  ASSERT_TRUE(BN_set_bit(large.get(), 0));
  ASSERT_TRUE(BN_set_bit(large.get(), 10000000));
  dh = NewDHGroup(large.get(), /*q=*/nullptr, g.get());
  ASSERT_TRUE(dh);
  check_invalid_group(dh.get());

  // q is too large.
  dh = NewDHGroup(p.get(), large.get(), g.get());
  ASSERT_TRUE(dh);
  check_invalid_group(dh.get());

  // Attempting to generate too large of a Diffie-Hellman group should fail.
  EXPECT_FALSE(
      DH_generate_parameters_ex(dh.get(), 20000, DH_GENERATOR_5, nullptr));
}